

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vis_helper.c
# Opt level: O1

uint64_t helper_pdist(uint64_t sum,uint64_t src1,uint64_t src2)

{
  uint uVar1;
  long lVar2;
  uint uVar3;
  
  lVar2 = 0x38;
  do {
    uVar3 = ((uint)(src1 >> ((byte)lVar2 & 0x3f)) & 0xff) -
            ((uint)(src2 >> ((byte)lVar2 & 0x3f)) & 0xff);
    uVar1 = -uVar3;
    if (0 < (int)uVar3) {
      uVar1 = uVar3;
    }
    sum = sum + uVar1;
    lVar2 = lVar2 + -8;
  } while (lVar2 != -8);
  return sum;
}

Assistant:

uint64_t helper_pdist(uint64_t sum, uint64_t src1, uint64_t src2)
{
    int i;
    for (i = 0; i < 8; i++) {
        int s1, s2;

        s1 = (src1 >> (56 - (i * 8))) & 0xff;
        s2 = (src2 >> (56 - (i * 8))) & 0xff;

        /* Absolute value of difference. */
        s1 -= s2;
        if (s1 < 0) {
            s1 = -s1;
        }

        sum += s1;
    }

    return sum;
}